

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

Status __thiscall wallet::SQLiteCursor::Next(SQLiteCursor *this,DataStream *key,DataStream *value)

{
  pointer pbVar1;
  int iVar2;
  size_t in_RCX;
  Status SVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Span<const_std::byte> SVar4;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_step(this->m_cursor_stmt);
  if (iVar2 == 100) {
    pbVar1 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    key->m_read_pos = 0;
    pbVar1 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    value->m_read_pos = 0;
    SVar4 = SpanFromBlob(this->m_cursor_stmt,0);
    DataStream::write(key,(int)SVar4.m_data,(void *)SVar4.m_size,in_RCX);
    SVar3 = MORE;
    SVar4 = SpanFromBlob(this->m_cursor_stmt,1);
    DataStream::write(value,(int)SVar4.m_data,(void *)SVar4.m_size,in_RCX);
  }
  else if (iVar2 == 0x65) {
    SVar3 = DONE;
  }
  else {
    local_30 = (char *)sqlite3_errstr(iVar2);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x61;
    logging_function._M_str = "Next";
    logging_function._M_len = 4;
    LogPrintFormatInternal<char[5],char_const*>
              (logging_function,source_file,0x23a,ALL,Info,(ConstevalFormatString<2U>)0xe0c88f,
               (char (*) [5])"Next",&local_30);
    SVar3 = FAIL;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status SQLiteCursor::Next(DataStream& key, DataStream& value)
{
    int res = sqlite3_step(m_cursor_stmt);
    if (res == SQLITE_DONE) {
        return Status::DONE;
    }
    if (res != SQLITE_ROW) {
        LogPrintf("%s: Unable to execute cursor step: %s\n", __func__, sqlite3_errstr(res));
        return Status::FAIL;
    }

    key.clear();
    value.clear();

    // Leftmost column in result is index 0
    key.write(SpanFromBlob(m_cursor_stmt, 0));
    value.write(SpanFromBlob(m_cursor_stmt, 1));
    return Status::MORE;
}